

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O0

SharedData * __thiscall Clasp::MinimizeBuilder::build(MinimizeBuilder *this,SharedContext *ctx)

{
  bool bVar1;
  size_type sVar2;
  Solver *pSVar3;
  SharedData *other;
  SharedContext *in_RSI;
  pod_vector<long,_std::allocator<long>_> *in_RDI;
  WeightVec *unaff_retaddr;
  SumVec *in_stack_00000008;
  SumVec *in_stack_00000010;
  Solver *in_stack_00000018;
  SharedData *ret;
  CmpWeight cmp;
  FlatVec weights;
  SumVec adjust;
  WeightVec prios;
  Solver *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  CmpWeight in_stack_ffffffffffffffa0;
  pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
  local_58 [3];
  pod_vector<int,_std::allocator<int>_> local_28 [2];
  SharedData *local_8;
  
  bVar1 = SharedContext::frozen(in_RSI);
  if (bVar1) {
    Potassco::fail(-2,"MinimizeBuilder::SharedData *Clasp::MinimizeBuilder::build(SharedContext &)",
                   0x2d4,"!ctx.frozen()",(char *)0x0);
  }
  bVar1 = SharedContext::ok((SharedContext *)
                            CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  if (bVar1) {
    SharedContext::master((SharedContext *)0x1b0fd9);
    Solver::acquireProblemVars
              ((Solver *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    SharedContext::master((SharedContext *)0x1b0feb);
    bVar1 = Solver::propagate(in_stack_ffffffffffffff78);
    if ((((bVar1 ^ 0xffU) & 1) == 0) && (bVar1 = empty((MinimizeBuilder *)0x1b1003), !bVar1)) {
      bk_lib::pod_vector<int,_std::allocator<int>_>::pod_vector
                ((pod_vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffa0.weights);
      bk_lib::pod_vector<long,_std::allocator<long>_>::pod_vector
                ((pod_vector<long,_std::allocator<long>_> *)in_stack_ffffffffffffffa0.weights);
      bk_lib::
      pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
      ::pod_vector(in_stack_ffffffffffffffa0.weights);
      CmpWeight::CmpWeight((CmpWeight *)&stack0xffffffffffffffa0,(WeightVec *)0x0);
      pSVar3 = SharedContext::master((SharedContext *)0x1b1060);
      prepareLevels((MinimizeBuilder *)ret,in_stack_00000018,in_stack_00000010,
                    (WeightVec *)in_stack_00000008);
      sVar2 = bk_lib::pod_vector<int,_std::allocator<int>_>::size(local_28);
      if (sVar2 < 2) {
        bVar1 = bk_lib::pod_vector<int,_std::allocator<int>_>::empty(local_28);
        in_stack_ffffffffffffff80 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff80);
        if (bVar1) {
          bk_lib::pod_vector<int,_std::allocator<int>_>::assign<int>
                    ((pod_vector<int,_std::allocator<int>_> *)
                     CONCAT44(sVar2,in_stack_ffffffffffffff80),
                     (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),(int)in_stack_ffffffffffffff78)
          ;
          bk_lib::pod_vector<long,_std::allocator<long>_>::assign<int>
                    (in_RDI,(int)((ulong)pSVar3 >> 0x20),(int)pSVar3);
        }
      }
      else {
        mergeLevels((MinimizeBuilder *)in_stack_00000010,in_stack_00000008,unaff_retaddr);
        in_stack_ffffffffffffffa0.weights = local_58;
      }
      other = createShared((MinimizeBuilder *)ret,(SharedContext *)in_stack_00000018,
                           in_stack_00000010,(CmpWeight *)in_stack_00000008);
      bk_lib::pod_vector<int,_std::allocator<int>_>::swap
                ((pod_vector<int,_std::allocator<int>_> *)CONCAT44(sVar2,in_stack_ffffffffffffff80),
                 (pod_vector<int,_std::allocator<int>_> *)other);
      clear((MinimizeBuilder *)in_stack_ffffffffffffffa0.weights);
      local_8 = other;
      bk_lib::
      pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
      ::~pod_vector((pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
                     *)0x1b11a7);
      bk_lib::pod_vector<long,_std::allocator<long>_>::~pod_vector
                ((pod_vector<long,_std::allocator<long>_> *)0x1b11b1);
      bk_lib::pod_vector<int,_std::allocator<int>_>::~pod_vector
                ((pod_vector<int,_std::allocator<int>_> *)0x1b11bb);
      return local_8;
    }
  }
  clear((MinimizeBuilder *)in_stack_ffffffffffffffa0.weights);
  return (SharedData *)0x0;
}

Assistant:

MinimizeBuilder::SharedData* MinimizeBuilder::build(SharedContext& ctx) {
	POTASSCO_REQUIRE(!ctx.frozen());
	if (!ctx.ok() || (ctx.master()->acquireProblemVars(), !ctx.master()->propagate()) || empty()) {
		clear();
		return 0;
	}
	typedef SharedData::WeightVec FlatVec;
	WeightVec prios;
	SumVec    adjust;
	FlatVec   weights;
	CmpWeight cmp(0);
	prepareLevels(*ctx.master(), adjust, prios);
	if (prios.size() > 1) {
		mergeLevels(adjust, weights);
		cmp.weights = &weights;
	}
	else if (prios.empty()) {
		prios.assign(1, 0);
		adjust.assign(1, 0);
	}
	SharedData* ret = createShared(ctx, adjust, cmp);
	ret->prios.swap(prios);
	clear();
	return ret;
}